

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

bool anon_unknown.dwarf_98ca::fs_get_file_contents(void *context,char *path,llb_data_t *data_out)

{
  FILE *__stream;
  size_t size;
  uint8_t *__ptr;
  size_t sVar1;
  bool bVar2;
  
  bVar2 = false;
  printf(" -- read file contents: %s\n");
  fflush(_stdout);
  __stream = fopen(path,"rb");
  if (__stream != (FILE *)0x0) {
    bVar2 = false;
    fseek(__stream,0,2);
    size = ftell(__stream);
    fseek(__stream,0,0);
    __ptr = (uint8_t *)llb_alloc(size);
    if (__ptr != (uint8_t *)0x0) {
      data_out->data = __ptr;
      data_out->length = size;
      sVar1 = fread(__ptr,1,size,__stream);
      bVar2 = (long)(int)sVar1 == size;
    }
  }
  return bVar2;
}

Assistant:

static bool fs_get_file_contents(void* context, const char* path,
                                llb_data_t* data_out) {
#if defined(_WIN32)
  llvm::SmallVector<llvm::UTF16, 20> wPath;
  llvm::convertUTF8ToUTF16String(path, wPath);
  wprintf(L" -- read file contents: %ls\n", (LPCWSTR)wPath.data());
  fflush(stdout);
  FILE* fp;
  if (_wfopen_s(&fp, (LPCWSTR)wPath.data(), L"rb")) {
    return false;
  }
#else
  printf(" -- read file contents: %s\n", path);
  fflush(stdout);

  FILE *fp = fopen(path, "rb");
  if (!fp) {
    return false;
  }
#endif

  fseek(fp, 0, SEEK_END);
  long size = ftell(fp);
  fseek(fp, 0, SEEK_SET);
  uint8_t* buffer = (uint8_t*)llb_alloc(size);
  if (!buffer) {
    return false;
  }
  data_out->data = buffer;
  data_out->length = size;
  int n = fread(buffer, 1, size, fp);
  if (n != size) {
    return false;
  }
  
  return true;
}